

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStringCommand.cxx
# Opt level: O2

bool anon_unknown.dwarf_11fb896::joinImpl
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args,string *glue,size_t varIdx,cmMakefile *makefile)

{
  pointer pbVar1;
  undefined1 uVar2;
  string_view separator;
  string_view value_00;
  string value;
  string local_48;
  cmStringRange local_28;
  
  pbVar1 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  local_28.End._M_current =
       (args->
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )._M_impl.super__Vector_impl_data._M_finish;
  local_28.Begin._M_current = pbVar1 + varIdx + 1;
  separator._M_str = (glue->_M_dataplus)._M_p;
  separator._M_len = glue->_M_string_length;
  cmJoin(&local_48,&local_28,separator,(string_view)ZEXT816(0));
  value_00._M_str = local_48._M_dataplus._M_p;
  value_00._M_len = local_48._M_string_length;
  cmMakefile::AddDefinition(makefile,pbVar1 + varIdx,value_00);
  uVar2 = std::__cxx11::string::~string((string *)&local_48);
  return (bool)uVar2;
}

Assistant:

bool joinImpl(std::vector<std::string> const& args, std::string const& glue,
              const size_t varIdx, cmMakefile& makefile)
{
  std::string const& variableName = args[varIdx];
  // NOTE Items to concat/join placed right after the variable for
  // both `CONCAT` and `JOIN` sub-commands.
  std::string value = cmJoin(cmMakeRange(args).advance(varIdx + 1), glue);

  makefile.AddDefinition(variableName, value);
  return true;
}